

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.c
# Opt level: O0

ASYNC_OPERATION_HANDLE
cbs_delete_token_async
          (CBS_HANDLE cbs,char *type,char *audience,
          ON_CBS_OPERATION_COMPLETE on_cbs_delete_token_complete,
          void *on_cbs_delete_token_complete_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  MESSAGE_HANDLE message_00;
  AMQP_VALUE map;
  LIST_ITEM_HANDLE item;
  ASYNC_OPERATION_HANDLE pAVar3;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LIST_ITEM_HANDLE list_item;
  CBS_OPERATION *cbs_operation;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  AMQP_VALUE application_properties;
  LOGGER_LOG l_2;
  MESSAGE_HANDLE message;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  ASYNC_OPERATION_HANDLE result;
  void *on_cbs_delete_token_complete_context_local;
  ON_CBS_OPERATION_COMPLETE on_cbs_delete_token_complete_local;
  char *audience_local;
  char *type_local;
  CBS_HANDLE cbs_local;
  
  if ((((cbs == (CBS_HANDLE)0x0) || (type == (char *)0x0)) || (audience == (char *)0x0)) ||
     (on_cbs_delete_token_complete == (ON_CBS_OPERATION_COMPLETE)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_delete_token_async",0x296,1,
                "Bad arguments: cbs = %p, type = %p, audience = %p, on_cbs_delete_token_complete = %p"
                ,cbs,type,audience,on_cbs_delete_token_complete);
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((cbs->cbs_state == CBS_STATE_CLOSED) || (cbs->cbs_state == CBS_STATE_ERROR)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c",
                "cbs_delete_token_async",0x29d,1,"put token called while closed or in error");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    message_00 = message_create();
    if (message_00 == (MESSAGE_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                  ,"cbs_delete_token_async",0x2a8,1,"message_create failed");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      map = amqpvalue_create_map();
      if (map == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                    ,"cbs_delete_token_async",0x2b1,1,"Failed creating application properties map");
        }
        l = (LOGGER_LOG)0x0;
      }
      else {
        iVar1 = add_string_key_value_pair_to_map(map,"name",audience);
        if (iVar1 == 0) {
          iVar1 = message_set_application_properties(message_00,map);
          if (iVar1 == 0) {
            l = (LOGGER_LOG)async_operation_create(cbs_put_token_cancel_handler,0x30);
            if ((ASYNC_OPERATION_HANDLE)l == (ASYNC_OPERATION_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                          ,"cbs_delete_token_async",0x2c9,1,
                          "Failed allocating async operation context");
              }
            }
            else {
              ((ASYNC_OPERATION_HANDLE)((long)l + 8))->async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_cbs_delete_token_complete;
              ((ASYNC_OPERATION_HANDLE)((long)l + 0x10))->async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)on_cbs_delete_token_complete_context;
              ((ASYNC_OPERATION_HANDLE)((long)l + 0x18))->async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)cbs->pending_operations;
              ((ASYNC_OPERATION_HANDLE)((long)l + 0x28))->async_operation_cancel_handler =
                   (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)l;
              item = singlylinkedlist_add
                               (cbs->pending_operations,(ASYNC_OPERATION_HANDLE)((long)l + 8));
              if (item == (LIST_ITEM_HANDLE)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                            ,"cbs_delete_token_async",0x2d9,1,
                            "Failed adding pending operation to list");
                }
                async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                l = (LOGGER_LOG)0x0;
              }
              else {
                pAVar3 = amqp_management_execute_operation_async
                                   (cbs->amqp_management,"delete-token",type,(char *)0x0,message_00,
                                    on_amqp_management_execute_operation_complete,item);
                ((ASYNC_OPERATION_HANDLE)((long)l + 0x20))->async_operation_cancel_handler =
                     (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar3;
                if (((ASYNC_OPERATION_HANDLE)((long)l + 0x20))->async_operation_cancel_handler ==
                    (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
                  singlylinkedlist_remove(cbs->pending_operations,item);
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                              ,"cbs_delete_token_async",0x2f0,1,
                              "Failed starting AMQP management operation");
                  }
                  async_operation_destroy((ASYNC_OPERATION_HANDLE)l);
                  l = (LOGGER_LOG)0x0;
                }
              }
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/cbs.c"
                        ,"cbs_delete_token_async",0x2c0,1,
                        "Failed setting message application properties");
            }
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          l = (LOGGER_LOG)0x0;
        }
        amqpvalue_destroy(map);
      }
      message_destroy(message_00);
    }
  }
  return (ASYNC_OPERATION_HANDLE)l;
}

Assistant:

ASYNC_OPERATION_HANDLE cbs_delete_token_async(CBS_HANDLE cbs, const char* type, const char* audience, ON_CBS_OPERATION_COMPLETE on_cbs_delete_token_complete, void* on_cbs_delete_token_complete_context)
{
    ASYNC_OPERATION_HANDLE result;

    /* Codes_SRS_CBS_01_086: [ `on_cbs_delete_token_complete_context` shall be allowed to be NULL. ]*/
    if ((cbs == NULL) ||
        (type == NULL) ||
        (audience == NULL) ||
        (on_cbs_delete_token_complete == NULL))
    {
        /* Codes_SRS_CBS_01_060: [ If any of the arguments `cbs`, `type`, `audience` or `on_cbs_delete_token_complete` is NULL `cbs_put_token_async` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: cbs = %p, type = %p, audience = %p, on_cbs_delete_token_complete = %p",
            cbs, type, audience, on_cbs_delete_token_complete);
        result = NULL;
    }
    else if ((cbs->cbs_state == CBS_STATE_CLOSED) ||
        (cbs->cbs_state == CBS_STATE_ERROR))
    {
        /* Codes_SRS_CBS_01_067: [ If `cbs_delete_token_async` is called when the CBS instance is not yet open or in error, it shall fail and return `NULL`. ]*/
        LogError("put token called while closed or in error");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_CBS_01_025: [ The body of the message MUST be empty. ]*/
        /* Codes_SRS_CBS_01_059: [ `cbs_delete_token_async` shall construct a request message for the `delete-token` operation. ]*/
        MESSAGE_HANDLE message = message_create();
        if (message == NULL)
        {
            /* Codes_SRS_CBS_01_071: [ If constructing the message fails, `cbs_delete_token_async` shall fail and return a non-zero value. ]*/
            LogError("message_create failed");
            result = NULL;
        }
        else
        {
            AMQP_VALUE application_properties = amqpvalue_create_map();
            if (application_properties == NULL)
            {
                /* Codes_SRS_CBS_01_071: [ If constructing the message fails, `cbs_delete_token_async` shall fail and return a non-zero value. ]*/
                LogError("Failed creating application properties map");
                result = NULL;
            }
            else
            {
                if (add_string_key_value_pair_to_map(application_properties, "name", audience) != 0)
                {
                    result = NULL;
                }
                else
                {
                    /* Codes_SRS_CBS_01_021: [ The request message has the following application-properties: ]*/
                    if (message_set_application_properties(message, application_properties) != 0)
                    {
                        /* Codes_SRS_CBS_01_071: [ If constructing the message fails, `cbs_delete_token_async` shall fail and return a non-zero value. ]*/
                        LogError("Failed setting message application properties");
                        result = NULL;
                    }
                    else
                    {
                        result = CREATE_ASYNC_OPERATION(CBS_OPERATION, cbs_put_token_cancel_handler);

                        if (result == NULL)
                        {
                            LogError("Failed allocating async operation context");
                        }
                        else
                        {
                            CBS_OPERATION* cbs_operation = GET_ASYNC_OPERATION_CONTEXT(CBS_OPERATION, result);

                            LIST_ITEM_HANDLE list_item;

                            cbs_operation->on_cbs_operation_complete = on_cbs_delete_token_complete;
                            cbs_operation->on_cbs_operation_complete_context = on_cbs_delete_token_complete_context;
                            cbs_operation->pending_operations = cbs->pending_operations;
                            cbs_operation->token_operation_async_context = result;

                            list_item = singlylinkedlist_add(cbs->pending_operations, cbs_operation);
                            if (list_item == NULL)
                            {
                                LogError("Failed adding pending operation to list");
                                async_operation_destroy(result);
                                result = NULL;
                            }
                            else
                            {
                                /* Codes_SRS_CBS_01_061: [ `cbs_delete_token_async` shall start the AMQP management operation by calling `amqp_management_execute_operation_async`, while passing to it: ]*/
                                /* Codes_SRS_CBS_01_085: [ The `amqp_management` argument shall be the one for the AMQP management instance created in `cbs_create`. ]*/
                                /* Codes_SRS_CBS_01_062: [ The `operation` argument shall be `delete-token`. ]*/
                                /* Codes_SRS_CBS_01_063: [ The `type` argument shall be set to the `type` argument. ]*/
                                /* Codes_SRS_CBS_01_064: [ The `locales` argument shall be set to NULL. ]*/
                                /* Codes_SRS_CBS_01_065: [ The `message` argument shall be the message constructed earlier according to the CBS spec. ]*/
                                /* Codes_SRS_CBS_01_066: [ The arguments `on_operation_complete` and `context` shall be set to a callback that is to be called by the AMQP management module when the operation is complete. ]*/
                                /* Codes_SRS_CBS_01_020: [ To instruct a peer to delete a token associated with a specific audience, a "delete-token" message can be sent to the CBS Node ]*/
                                /* Codes_SRS_CBS_01_022: [ operation    Yes    string    "delete-token" ]*/
                                /* Codes_SRS_CBS_01_023: [ Type    Yes    string    The type of the token being deleted, e.g., "amqp:jwt". ]*/
                                /* Codes_SRS_CBS_01_024: [ name    Yes    string    The "audience" of the token being deleted. ]*/
                                cbs_operation->amqp_management_async_context = amqp_management_execute_operation_async(cbs->amqp_management, "delete-token", type, NULL, message, on_amqp_management_execute_operation_complete, list_item);
                                
                                if (cbs_operation->amqp_management_async_context == NULL)
                                {
                                    /* Codes_SRS_CBS_01_087: [ If `amqp_management_execute_operation_async` fails `cbs_put_token_async` shall fail and return a non-zero value. ]*/
                                    singlylinkedlist_remove(cbs->pending_operations, list_item);
                                    LogError("Failed starting AMQP management operation");
                                    async_operation_destroy(result);
                                    result = NULL;
                                }
                                else
                                {
                                    /* Codes_SRS_CBS_01_082: [ On success `cbs_delete_token_async` shall return an ASYNC_OPERATION_HANDLE. ]*/
                                }
                            }
                        }
                    }
                }

                amqpvalue_destroy(application_properties);
            }

            message_destroy(message);
        }
    }
    return result;
}